

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O1

void __thiscall
TPZTransfer<std::complex<double>_>::TransferSolution
          (TPZTransfer<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *coarsesol,
          TPZFMatrix<std::complex<double>_> *finesol)

{
  int64_t iVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  complex<double> *pcVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  TPZFMatrix<std::complex<double>_> tempcoarse;
  TPZFMatrix<std::complex<double>_> tempfine;
  uint local_1f4;
  TPZFMatrix<std::complex<double>_> local_150;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  local_1f4 = (uint)(finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  lVar5 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  iVar11 = *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.field_0x1c;
  uVar12 = (uint)(coarsesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  uVar10 = (uint)lVar5;
  if ((local_1f4 != uVar12) ||
     ((long)(int)(finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow !=
      lVar5 * iVar11)) {
    (*(finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xe])(finesol,(long)(int)(iVar11 * uVar10),(long)(int)uVar12);
    local_1f4 = uVar12;
  }
  if (*(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.field_0x1c == 1) {
    MultiplyScalar(this,coarsesol,finesol,0);
    return;
  }
  if (0 < *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.field_0x1c) {
    lVar5 = (long)(int)iVar1;
    uVar7 = lVar5 * (int)uVar12;
    uVar9 = (long)(int)uVar10 * (long)(int)local_1f4;
    iVar11 = 0;
    do {
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
      local_150.fSize = 0;
      local_150.fElem = (complex<double> *)0x0;
      local_150.fGiven = (complex<double> *)0x0;
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar5;
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = (long)(int)uVar12;
      TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
      local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
      local_150.fPivot.super_TPZVec<int>.fNElements = 0;
      local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
      local_150.fWork.fNAlloc = 0;
      local_150.fWork.fStore = (complex<double> *)0x0;
      local_150.fWork.fNElements = 0;
      if (uVar7 != 0) {
        pcVar6 = (complex<double> *)operator_new__(-(ulong)(uVar7 >> 0x3c != 0) | uVar7 * 0x10);
        memset(pcVar6,0,uVar7 * 0x10);
        local_150.fElem = pcVar6;
      }
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
      local_c0.fElem = (complex<double> *)0x0;
      local_c0.fGiven = (complex<double> *)0x0;
      local_c0.fSize = 0;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = (long)(int)uVar10;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol =
           (long)(int)local_1f4;
      TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
      local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
      local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
      local_c0.fWork.fStore = (complex<double> *)0x0;
      local_c0.fWork.fNElements = 0;
      local_c0.fWork.fNAlloc = 0;
      if (uVar9 != 0) {
        pcVar6 = (complex<double> *)operator_new__(-(ulong)(uVar9 >> 0x3c != 0) | uVar9 * 0x10);
        memset(pcVar6,0,uVar9 * 0x10);
        local_c0.fElem = pcVar6;
      }
      if (0 < (int)uVar10) {
        uVar13 = 0;
        do {
          if (0 < (int)local_1f4) {
            uVar8 = 0;
            do {
              (*(coarsesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x24])
                        (coarsesol,
                         (long)(*(int *)&(this->super_TPZMatrix<std::complex<double>_>).
                                         super_TPZBaseMatrix.field_0x1c * (int)uVar13 + iVar11),
                         uVar8);
              if ((local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <=
                   (long)uVar13) ||
                 (local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <=
                  (long)uVar8)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(ulong *)local_150.fElem
                        [local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                         uVar8 + uVar13]._M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
              *(undefined8 *)
               ((long)local_150.fElem
                      [local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                       uVar8 + uVar13]._M_value + 8) = in_XMM1_Qa;
              uVar8 = uVar8 + 1;
            } while (local_1f4 != uVar8);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uVar10 & 0x7fffffff));
      }
      MultiplyScalar(this,&local_150,&local_c0,0);
      if (0 < (int)uVar10) {
        uVar13 = 0;
        do {
          if (0 < (int)local_1f4) {
            uVar8 = 0;
            do {
              uVar3 = *(undefined8 *)
                       ((long)local_c0.fElem
                              [local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                               fRow * uVar8 + uVar13]._M_value + 8);
              iVar4 = *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                               field_0x1c * (int)uVar13 + iVar11;
              if (((iVar4 < 0) ||
                  ((finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                   (long)iVar4)) ||
                 ((finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                  (long)uVar8)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar2 = (finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
              pcVar6 = finesol->fElem;
              *(undefined8 *)pcVar6[lVar2 * uVar8 + (long)iVar4]._M_value =
                   *(undefined8 *)
                    local_c0.fElem
                    [local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                     uVar8 + uVar13]._M_value;
              *(undefined8 *)(pcVar6[lVar2 * uVar8 + (long)iVar4]._M_value + 8) = uVar3;
              uVar8 = uVar8 + 1;
            } while (local_1f4 != uVar8);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uVar10 & 0x7fffffff));
      }
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_150);
      iVar11 = iVar11 + 1;
    } while (iVar11 < *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                               field_0x1c);
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::TransferSolution(const TPZFMatrix<TVar> &coarsesol, TPZFMatrix<TVar> &finesol){
	int iv;
	int nrf = finesol.Rows();
	int ncf = finesol.Cols();
	int nrc = coarsesol.Rows();
	int ncc = coarsesol.Cols();
    int thisr = this->Rows();
    int thisc = this->Cols();
	if(nrf != this->Rows()*fNTVarVar || ncf != ncc) {
		nrf = this->Rows()*fNTVarVar;
		ncf = ncc;
		finesol.Redim(nrf,ncf);
	}
    if (fNTVarVar == 1) {
        MultiplyScalar(coarsesol,finesol,0);
    }
    else
    {
        for(iv=0; iv<fNTVarVar; iv++) {
            TPZFMatrix<TVar> tempcoarse(thisc,ncc), tempfine(thisr,ncf);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncf; c++) {
                    tempcoarse(i,c) = coarsesol.GetVal(iv+i*fNTVarVar,c);

                }
            }
            MultiplyScalar(tempcoarse, tempfine, 0);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncf; c++) {
                    finesol(iv+i*fNTVarVar,c) = tempfine.GetVal(i,c);
                    
                }
            }
        }
    }
}